

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::IsPlanar(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  uint uVar1;
  ON_Curve **ppOVar2;
  double dVar3;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ON_Plane *pOVar12;
  ON_Curve *pOVar13;
  ON_Plane *pOVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double in_XMM1_Qa;
  ON_3dVector X;
  ON_3dPoint best_Y;
  ON_3dVector Y;
  ON_Line line;
  ON_3dPoint R;
  ON_Interval d;
  ON_Plane test_plane;
  double local_1c8;
  ON_3dVector local_1a8;
  ON_3dPoint local_188;
  ON_3dPoint local_170;
  ON_Line local_158;
  ON_3dPoint local_128;
  ON_Interval local_108;
  double local_f8;
  ulong uStack_f0;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  bVar17 = 0;
  iVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar7 == 2) {
    bVar4 = ON_Curve::IsPlanar(&this->super_ON_Curve,plane,tolerance);
    return bVar4;
  }
  ON_Plane::ON_Plane(&local_b0);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((long)(int)uVar1 < 1) {
    pOVar13 = (ON_Curve *)0x0;
  }
  else {
    pOVar13 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  }
  uVar18 = SUB84(tolerance,0);
  if (pOVar13 != (ON_Curve *)0x0 && uVar1 == 1) {
    iVar7 = (*(pOVar13->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x32])
                      (uVar18,pOVar13,plane);
    cVar5 = (char)iVar7;
    goto LAB_00590033;
  }
  if (1 < (int)uVar1) {
    iVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                      (uVar18,this);
    if ((char)iVar7 != '\0') {
      cVar5 = '\x01';
      if (plane != (ON_Plane *)0x0) {
        ON_Curve::PointAtStart(&local_c8,&this->super_ON_Curve);
        ON_Curve::PointAtEnd(&local_e0,&this->super_ON_Curve);
        from_pt.y = local_c8.y;
        from_pt.x = local_c8.x;
        from_pt.z = local_c8.z;
        to_pt.y = local_e0.y;
        to_pt.x = local_e0.x;
        to_pt.z = local_e0.z;
        ON_Line::ON_Line(&local_158,from_pt,to_pt);
        bVar4 = ON_Line::InPlane(&local_158,plane,tolerance);
        if (!bVar4) {
          ON_Line::InPlane(&local_158,plane,0.0);
        }
        ON_Line::~ON_Line(&local_158);
      }
      goto LAB_00590033;
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_108.m_t[1] = in_XMM1_Qa;
    pdVar8 = ON_Interval::operator[](&local_108,0);
    bVar4 = ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar8,&local_158.from,&local_1a8,0,(int *)0x0);
    if ((bVar4) && (bVar4 = ON_3dVector::Unitize(&local_1a8), bVar4)) {
      ON_3dPoint::operator+(&local_188,&local_158.from,&local_1a8);
      local_188.z = ON_3dPoint::Origin.z;
      local_188.x = ON_3dPoint::Origin.x;
      local_188.y = ON_3dPoint::Origin.y;
      local_1c8 = 1.0;
      uVar15 = 2;
      do {
        uVar11 = 1;
        do {
          dVar3 = ON_Interval::ParameterAt(&local_108,(double)(int)uVar11 / (double)(int)uVar15);
          ON_Curve::PointAt(&local_170,&this->super_ON_Curve,dVar3);
          local_128.z = local_170.z;
          local_128.x = local_170.x;
          local_128.y = local_170.y;
          ON_3dPoint::operator-((ON_3dVector *)&local_170,&local_128,&local_158.from);
          bVar4 = ON_3dVector::Unitize((ON_3dVector *)&local_170);
          cVar5 = '\a';
          if (bVar4) {
            iVar7 = ON_3dVector::IsParallelTo
                              (&local_1a8,(ON_3dVector *)&local_170,0.017453292519943295);
            if (iVar7 == 0) {
              cVar5 = ON_Plane::CreateFromFrame
                                (&local_b0,&local_158.from,&local_1a8,(ON_3dVector *)&local_170);
            }
            else {
              in_XMM1_Qa = ON_3dVector::operator*(&local_1a8,(ON_3dVector *)&local_170);
              in_XMM1_Qa = ABS(in_XMM1_Qa);
              uStack_f0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
              cVar5 = '\0';
              local_f8 = in_XMM1_Qa;
              if (in_XMM1_Qa < local_1c8) {
                ON_3dPoint::operator=(&local_188,(ON_3dVector *)&local_170);
                local_1c8 = local_f8;
              }
            }
          }
          if ((cVar5 != '\a') && (cVar5 != '\0')) goto LAB_0058ffc5;
          uVar11 = uVar11 + 2;
        } while (uVar11 < uVar15);
        bVar4 = uVar15 < 0xf;
        uVar15 = uVar15 + 2;
      } while (bVar4);
      if (local_1c8 < 1.0) {
        ON_3dVector::ON_3dVector((ON_3dVector *)&local_170,&local_188);
        bVar4 = ON_Plane::CreateFromFrame
                          (&local_b0,&local_158.from,&local_1a8,(ON_3dVector *)&local_170);
        if (bVar4) {
LAB_0058ffc5:
          iVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x33])
                            (uVar18,this,&local_b0);
          cVar5 = (char)iVar7;
          if (cVar5 == '\x01' && plane != (ON_Plane *)0x0) {
            pOVar12 = &local_b0;
            pOVar14 = plane;
            for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pOVar14->origin).x = (pOVar12->origin).x;
              pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar17 * -2 + 1) * 8);
              pOVar14 = (ON_Plane *)((long)pOVar14 + (ulong)bVar17 * -0x10 + 8);
            }
            iVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34]
                    )(this);
            if (((char)iVar7 != '\0') &&
               (iVar7 = ON_ClosedCurveOrientation(&this->super_ON_Curve,plane), iVar7 < 0)) {
              ON_Plane::Flip(plane);
            }
          }
          goto LAB_00590033;
        }
      }
    }
    bVar4 = ON_Curve::Ev1Der(&this->super_ON_Curve,*(this->m_t).m_a,&local_158.from,&local_1a8,0,
                             (int *)0x0);
    if (bVar4) {
      bVar4 = ON_3dVector::Unitize(&local_1a8);
      if (!bVar4) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
        local_108.m_t[1] = in_XMM1_Qa;
        dVar3 = ON_Interval::ParameterAt(&local_108,0.5);
        ON_Curve::PointAt(&local_170,&this->super_ON_Curve,dVar3);
        ON_3dPoint::operator-((ON_3dVector *)&local_188,&local_170,&local_158.from);
        local_1a8.z = local_188.z;
        local_1a8.x = local_188.x;
        local_1a8.y = local_188.y;
        bVar4 = ON_3dVector::Unitize(&local_1a8);
        if (!bVar4) goto LAB_00590031;
      }
      uVar9 = 2;
      if (2 < (int)uVar1) {
        uVar9 = (ulong)uVar1;
      }
      bVar4 = true;
      uVar16 = 2;
      do {
        ppOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        if (ppOVar2[uVar16 - 1] != (ON_Curve *)0x0) {
          pOVar13 = ppOVar2[uVar16 - 1];
          (*(ppOVar2[uVar16 - 1]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          local_170.y = in_XMM1_Qa;
          dVar3 = ON_Interval::ParameterAt((ON_Interval *)&local_170,0.5);
          ON_Curve::PointAt(&local_188,pOVar13,dVar3);
          local_128.z = local_188.z;
          local_128.x = local_188.x;
          local_128.y = local_188.y;
          ON_3dPoint::operator-((ON_3dVector *)&local_188,&local_128,&local_158.from);
          bVar6 = ON_Plane::CreateFromFrame
                            (&local_b0,&local_158.from,&local_1a8,(ON_3dVector *)&local_188);
          if (bVar6) {
            if (bVar4) goto LAB_0058ffc5;
            break;
          }
        }
        bVar4 = uVar16 < (ulong)(long)(int)uVar1;
        lVar10 = (1 - uVar9) + uVar16;
        uVar16 = uVar16 + 1;
      } while (lVar10 != 1);
    }
  }
LAB_00590031:
  cVar5 = '\0';
LAB_00590033:
  ON_Plane::~ON_Plane(&local_b0);
  return (bool)cVar5;
}

Assistant:

bool
ON_PolyCurve::IsPlanar(
      ON_Plane* plane, // if not nullptr and true is returned, then plane parameters
                         // are filled in
      double tolerance // tolerance to use when checking linearity
      ) const
{
  if ( Dimension() == 2 )
  {
    return ON_Curve::IsPlanar(plane,tolerance);
  }

  bool rc = false;
  ON_Plane test_plane;
  const int count = Count();
  const ON_Curve* crv = FirstSegmentCurve();
  if ( count == 1 && crv )
    rc = crv->IsPlanar( plane, tolerance );
  else if ( count > 1 )
  {
    if ( IsLinear(tolerance) )
    {
      if ( plane )
      {
        ON_Line line(PointAtStart(), PointAtEnd() );
        if ( !line.InPlane( *plane, tolerance ) )
          line.InPlane( *plane, 0.0 );
      }
      return true;
    }
    if ( !GetTestPlane( *this, test_plane ) )
    {
      // 5 May 2006 Dale Lear
      //   Added additional attempts to get a test_plane
      //   for poorly parameterized polycurves. (RR 20057 fix).
      ON_3dPoint P, Q;
      ON_3dVector X;
      if (!Ev1Der(m_t[0],P,X))
        return false;

      if ( !X.Unitize() )
      {
        X = PointAt(Domain().ParameterAt(0.5)) - P;
        if ( !X.Unitize() )
          return false;
      }

      int i;
      for ( i = 1; i < count; i++ )
      {
        if ( m_segment[i] )
        {
          Q = m_segment[i]->PointAt(m_segment[i]->Domain().ParameterAt(0.5));
          if ( test_plane.CreateFromFrame(P,X,Q-P) )
            break;
        }
      }
      if ( i >= count )
        return false;
    }
    rc = IsInPlane( test_plane, tolerance );
    if (rc && plane)
      *plane = test_plane;

    // RH-75060 GBA 9-June-23 
     // For a planar simple closed curve we should return the plane
     // whose orientation that matches the curve orientation.
    if (rc && plane && IsClosed())
    {
      if (ON_ClosedCurveOrientation(*this, *plane) < 0)
        plane->Flip();
    }
  }
  return rc;
}